

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.c
# Opt level: O0

void pacman(dw_rom *rom)

{
  dw_rom *rom_local;
  
  vpatch(rom,0x13b4,0x4f,0x50,0,0x51,0,0x52,0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,0,0x50,0,0x51,0,0x52,
         0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,0,0x50,0,0x51,0,0x52,0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,
         0,0x50,0,0x51,0,0x52,0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,0,0x50,0);
  vpatch(rom,0x14b4,0xf,0x48,0,0x49,0,0x4a,0,0x4b,0,0x4c,0,0x4d,0,0x4e,0,0x4f);
  vpatch(rom,0x14d4,0xf,0x48,0,0x49,0,0x4a,0,0x4b,0,0x4c,0,0x4d,0,0x4e,0,0x4f);
  vpatch(rom,0x14f4,0xd,0x48,0,0xa9,3,0x4a,0,0xab,3,0x4c,0,0xad,3,0x4e);
  vpatch(rom,0x15b4,0x43,0x30,0,0x31,0,0x32,0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,0,0x30,0,0x31,0,0x32,
         0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,0,0x30,0,0x31,0,0x32,0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,
         0,0x30,0,0x31,0,0x32,0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,0,0xb4,3);
  vpatch(rom,0x15fe,1,0x35);
  vpatch(rom,0x16b4,0x43,0x40,0,0x41,0,0x42,0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,0,0x40,0,0x41,0,0x42,
         0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,0,0x40,0,0x41,0,0x42,0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,
         0,0x40,0,0x41,0,0x42,0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,0,0xb8,3);
  vpatch(rom,0x16fe,1,0x45);
  vpatch(rom,0x1a8b,3,0x34,0x12,0x27);
  vpatch(rom,0x12015,2,0x1d,0xd);
  vpatch(rom,0x12055,2,0xd0);
  vpatch(rom,0x120d5,2,0x1d);
  vpatch(rom,0x12115,2,0xa0);
  vpatch(rom,0x12195,2,5);
  vpatch(rom,0x12300,0x80,0,0,0xf,0x3f,0x7f,0x7f,0xff,0xff,0,0,0xf,0x3f,0x7f,0x7f,0xff,0xff,0,0,0xc0
         ,0xf0,0xf8,0xf8,0xfc,0xfc,0,0,0xc0,0xf0,0xf8,0xf8,0xfc,0xfc,0xfc,0xfc,0xf8,0x78,0x70,0x30,0
         ,0,0xfc,0xfc,0xf8,0x78,0x70,0x30,0,0,0xfc,0xfc,0x7c,0x78,0x38,0x30,0,0,0xfc,0xfc,0x7c,0x78,
         0x38,0x30,0,0,0,0);
  vpatch(rom,0x12395,2,0xa0);
  vpatch(rom,0x12400,0x180,0,0,7,0x1f,0x3f,0x3f,0x7f,0x7f,0,0,7,0x1f,0x3f,0x3f,0x7f,0x7f,0,0,0x80,
         0xe0,0xf0,0xf8,0xf8,0xfc,0,0,0x80,0xe0,0xf0,0xf8,0xf8,0xfc,0x7f,0x7f,0x7f,0x7f,0x3f,0x3f,
         0x1f,7,0x7f,0x7f,0x7f,0x7f,0x3f,0x3f,0x1f,7,0xfc,0xfc,0xfc,0xf8,0xf8,0xf0,0xe0,0x80,0xfc,
         0xfc,0xfc,0xf8,0xf8,0xf0,0xe0,0x80,0,0);
  return;
}

Assistant:

static void pacman(dw_rom *rom)
{
    vpatch(rom, 0x013b4,   79,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57);
    vpatch(rom, 0x014b4,   15,  0x48,  0x00,  0x49,  0x00,  0x4a,  0x00,  0x4b,  0x00,  0x4c,  0x00,  0x4d,  0x00,  0x4e,  0x00,  0x4f);
    vpatch(rom, 0x014d4,   15,  0x48,  0x00,  0x49,  0x00,  0x4a,  0x00,  0x4b,  0x00,  0x4c,  0x00,  0x4d,  0x00,  0x4e,  0x00,  0x4f);
    vpatch(rom, 0x014f4,   13,  0x48,  0x00,  0xa9,  0x03,  0x4a,  0x00,  0xab,  0x03,  0x4c,  0x00,  0xad,  0x03,  0x4e);
    vpatch(rom, 0x015b4,   67,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0xb4,  0x03,  0x31);
    vpatch(rom, 0x015fe,    1,  0x35);
    vpatch(rom, 0x016b4,   67,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0xb8,  0x03,  0x41);
    vpatch(rom, 0x016fe,    1,  0x45);
    vpatch(rom, 0x01a8b,    3,  0x34,  0x12,  0x27);
    vpatch(rom, 0x12015,    2,  0x1d,  0x0d);
    vpatch(rom, 0x12055,    2,  0xd0,  0xd0);
    vpatch(rom, 0x120d5,    2,  0x1d,  0x1d);
    vpatch(rom, 0x12115,    2,  0xa0,  0xa0);
    vpatch(rom, 0x12195,    2,  0x05,  0x05);
    vpatch(rom, 0x12300,  128,  0x00,  0x00,  0x0f,  0x3f,  0x7f,  0x7f,  0xff,  0xff,  0x00,  0x00,  0x0f,  0x3f,  0x7f,  0x7f,  0xff,  0xff,  0x00,  0x00,  0xc0,  0xf0,  0xf8,  0xf8,  0xfc,  0xfc,  0x00,  0x00,  0xc0,  0xf0,  0xf8,  0xf8,  0xfc,  0xfc,  0xfc,  0xfc,  0xf8,  0x78,  0x70,  0x30,  0x00,  0x00,  0xfc,  0xfc,  0xf8,  0x78,  0x70,  0x30,  0x00,  0x00,  0xfc,  0xfc,  0x7c,  0x78,  0x38,  0x30,  0x00,  0x00,  0xfc,  0xfc,  0x7c,  0x78,  0x38,  0x30,  0x00,  0x00,  0x00,  0x00,  0x07,  0x1f,  0x3f,  0x7f,  0x7f,  0xff,  0x00,  0x00,  0x07,  0x1f,  0x3f,  0x7f,  0x7f,  0xff,  0x00,  0x00,  0x80,  0xe0,  0xf0,  0xf8,  0xf8,  0xfc,  0x00,  0x00,  0x80,  0xe0,  0xf0,  0xf8,  0xf8,  0xfc,  0xff,  0xff,  0xff,  0x7f,  0x7f,  0x3f,  0x0f,  0x00,  0xff,  0xff,  0xff,  0x7f,  0x7f,  0x3f,  0x0f,  0x00,  0xfc,  0xfc,  0xfc,  0xf8,  0xf8,  0xf0,  0xc0,  0x00,  0xfc,  0xfc,  0xfc,  0xf8,  0xf8,  0xf0,  0xc0,  0x00);
    vpatch(rom, 0x12395,    2,  0xa0,  0xa0);
    vpatch(rom, 0x12400,  384,  0x00,  0x00,  0x07,  0x1f,  0x3f,  0x3f,  0x7f,  0x7f,  0x00,  0x00,  0x07,  0x1f,  0x3f,  0x3f,  0x7f,  0x7f,  0x00,  0x00,  0x80,  0xe0,  0xf0,  0xf8,  0xf8,  0xfc,  0x00,  0x00,  0x80,  0xe0,  0xf0,  0xf8,  0xf8,  0xfc,  0x7f,  0x7f,  0x7f,  0x7f,  0x3f,  0x3f,  0x1f,  0x07,  0x7f,  0x7f,  0x7f,  0x7f,  0x3f,  0x3f,  0x1f,  0x07,  0xfc,  0xfc,  0xfc,  0xf8,  0xf8,  0xf0,  0xe0,  0x80,  0xfc,  0xfc,  0xfc,  0xf8,  0xf8,  0xf0,  0xe0,  0x80,  0x00,  0x00,  0x07,  0x1f,  0x3f,  0x3f,  0x0f,  0x03,  0x00,  0x00,  0x07,  0x1f,  0x3f,  0x3f,  0x0f,  0x03,  0x00,  0x00,  0xc0,  0xf0,  0xf8,  0xf8,  0xfc,  0xfc,  0x00,  0x00,  0xc0,  0xf0,  0xf8,  0xf8,  0xfc,  0xfc,  0x00,  0x00,  0x03,  0x0f,  0x3f,  0x3f,  0x1f,  0x07,  0x00,  0x00,  0x03,  0x0f,  0x3f,  0x3f,  0x1f,  0x07,  0xfc,  0xfc,  0xfc,  0xfc,  0xf8,  0xf8,  0xf0,  0xc0,  0xfc,  0xfc,  0xfc,  0xfc,  0xf8,  0xf8,  0xf0,  0xc0,  0x00,  0x00,  0x03,  0x0f,  0x1f,  0x1f,  0x3f,  0x3f,  0x00,  0x00,  0x03,  0x0f,  0x1f,  0x1f,  0x3f,  0x3f,  0x00,  0x00,  0xe0,  0xf8,  0xfc,  0xfc,  0xf0,  0xc0,  0x00,  0x00,  0xe0,  0xf8,  0xfc,  0xfc,  0xf0,  0xc0,  0x3f,  0x3f,  0x3f,  0x3f,  0x1f,  0x1f,  0x0f,  0x03,  0x3f,  0x3f,  0x3f,  0x3f,  0x1f,  0x1f,  0x0f,  0x03,  0x00,  0x00,  0xc0,  0xf0,  0xfc,  0xfc,  0xf8,  0xe0,  0x00,  0x00,  0xc0,  0xf0,  0xfc,  0xfc,  0xf8,  0xe0,  0x00,  0x00,  0x01,  0x07,  0x0f,  0x1f,  0x1f,  0x3f,  0x00,  0x00,  0x01,  0x07,  0x0f,  0x1f,  0x1f,  0x3f,  0x00,  0x00,  0xe0,  0xf8,  0xfc,  0xfc,  0xfe,  0xfe,  0x00,  0x00,  0xe0,  0xf8,  0xfc,  0xfc,  0xfe,  0xfe,  0x3f,  0x3f,  0x3f,  0x1f,  0x1f,  0x0f,  0x07,  0x01,  0x3f,  0x3f,  0x3f,  0x1f,  0x1f,  0x0f,  0x07,  0x01,  0xfe,  0xfe,  0xfe,  0xfe,  0xfc,  0xfc,  0xf8,  0xe0,  0xfe,  0xfe,  0xfe,  0xfe,  0xfc,  0xfc,  0xf8,  0xe0,  0x00,  0x00,  0x0c,  0x1c,  0x1e,  0x3e,  0x3f,  0x3f,  0x00,  0x00,  0x0c,  0x1c,  0x1e,  0x3e,  0x3f,  0x3f,  0x00,  0x00,  0x0c,  0x0e,  0x1e,  0x1f,  0x3f,  0x3f,  0x00,  0x00,  0x0c,  0x0e,  0x1e,  0x1f,  0x3f,  0x3f,  0x3f,  0x3f,  0x1f,  0x1f,  0x0f,  0x03,  0x00,  0x00,  0x3f,  0x3f,  0x1f,  0x1f,  0x0f,  0x03,  0x00,  0x00,  0xff,  0xff,  0xfe,  0xfe,  0xfc,  0xf0,  0x00,  0x00,  0xff,  0xff,  0xfe,  0xfe,  0xfc,  0xf0,  0x00,  0x00,  0x00,  0x03,  0x0f,  0x1f,  0x1f,  0x3f,  0x3f,  0x3f,  0x00,  0x03,  0x0f,  0x1f,  0x1f,  0x3f,  0x3f,  0x3f,  0x00,  0xf0,  0xfc,  0xfe,  0xfe,  0xff,  0xff,  0xff,  0x00,  0xf0,  0xfc,  0xfe,  0xfe,  0xff,  0xff,  0xff,  0x3f,  0x1f,  0x1f,  0x0f,  0x07,  0x01,  0x00,  0x00,  0x3f,  0x1f,  0x1f,  0x0f,  0x07,  0x01,  0x00,  0x00,  0xff,  0xfe,  0xfe,  0xfc,  0xf8,  0xe0,  0x00,  0x00,  0xff,  0xfe,  0xfe,  0xfc,  0xf8,  0xe0,  0x00,  0x00);
}